

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O0

GdlRuleItem * __thiscall GdlRule::InputItem(GdlRule *this,int n)

{
  size_type_conflict sVar1;
  reference ppGVar2;
  int in_ESI;
  long in_RDI;
  size_t i;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::size
                      ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30));
    if (sVar1 <= local_20) {
      return (GdlRuleItem *)0x0;
    }
    ppGVar2 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                        ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30),
                         local_20);
    if ((*ppGVar2)->m_nInputIndex == in_ESI) break;
    local_20 = local_20 + 1;
  }
  ppGVar2 = std::vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_>::operator[]
                      ((vector<GdlRuleItem_*,_std::allocator<GdlRuleItem_*>_> *)(in_RDI + 0x30),
                       local_20);
  return *ppGVar2;
}

Assistant:

GdlRuleItem * GdlRule::InputItem(int n)
{
	for (size_t i = 0; i < m_vprit.size(); i++)
	{
		if (m_vprit[i]->m_nInputIndex == n)
			return m_vprit[i];
	}
	return NULL;
}